

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O0

void __thiscall
pktalloc::CustomBitSet<2048U>::ClearRange(CustomBitSet<2048U> *this,uint bitStart,uint bitEnd)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  WordT mask_1;
  uint lastWordBits;
  uint i;
  WordT mask;
  uint wordEnd;
  uint wordStart;
  uint bitEnd_local;
  uint bitStart_local;
  CustomBitSet<2048U> *this_local;
  
  if (bitStart < bitEnd) {
    i = bitStart >> 6;
    uVar2 = bitEnd >> 6;
    bVar1 = (byte)bitStart & 0x3f;
    if (uVar2 == i) {
      *(ulong *)(this + (ulong)i * 8) =
           ((1L << (((byte)bitEnd & 0x3f) - bVar1 & 0x3f)) + -1 << bVar1 ^ 0xffffffffffffffffU) &
           *(ulong *)(this + (ulong)i * 8);
    }
    else {
      *(ulong *)(this + (ulong)i * 8) =
           (-1L << bVar1 ^ 0xffffffffffffffffU) & *(ulong *)(this + (ulong)i * 8);
      while (i = i + 1, i < uVar2) {
        *(undefined8 *)(this + (ulong)i * 8) = 0;
      }
      iVar3 = bitEnd + uVar2 * -0x40;
      if (iVar3 != 0) {
        *(ulong *)(this + (ulong)uVar2 * 8) =
             ((1L << ((byte)iVar3 & 0x3f)) - 1U ^ 0xffffffffffffffff) &
             *(ulong *)(this + (ulong)uVar2 * 8);
      }
    }
  }
  return;
}

Assistant:

void ClearRange(unsigned bitStart, unsigned bitEnd)
    {
        if (bitStart >= bitEnd) {
            return;
        }

        unsigned wordStart = bitStart / kWordBits;
        const unsigned wordEnd = bitEnd / kWordBits;

        bitStart %= kWordBits;

        if (wordEnd == wordStart)
        {
            // This implies x=(bitStart % kWordBits) and y=(bitEnd % kWordBits)
            // are in the same word.  Also: x < y, y < 64, y - x < 64.
            bitEnd %= kWordBits;
            WordT mask = ((WordT)1 << (bitEnd - bitStart)) - 1; // 1..63 bits
            mask <<= bitStart;
            Words[wordStart] &= ~mask;
            return;
        }

        // Clear the end of the first word
        Words[wordStart] &= ~(kAllOnes << bitStart);

        // Whole words at a time
        for (unsigned i = wordStart + 1; i < wordEnd; ++i) {
            Words[i] = 0;
        }

        // Clear first few bits of the last word
        unsigned lastWordBits = bitEnd - wordEnd * kWordBits;
        if (lastWordBits > 0)
        {
            WordT mask = ((WordT)1 << lastWordBits) - 1; // 1..63 bits
            Words[wordEnd] &= ~mask;
        }
    }